

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenuadaptor.cpp
# Opt level: O0

QDBusVariant * __thiscall QDBusMenuAdaptor::GetProperty(QDBusMenuAdaptor *this,int id,QString *name)

{
  bool bVar1;
  QMessageLogger *in_RCX;
  QLoggingCategory *in_RDI;
  long in_FS_OFFSET;
  QDBusVariant *value;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QLoggingCategory *this_00;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  QDebug local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QtPrivateLogging::qLcMenu();
  anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)this_00,in_RDI);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_1e2e9c4::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xae9489);
    QMessageLogger::QMessageLogger
              (in_RCX,(char *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
               (int)((ulong)this_00 >> 0x20),(char *)in_RDI,(char *)0xae949f);
    QMessageLogger::debug();
    QDebug::operator<<((QDebug *)this_00,(int)((ulong)in_RDI >> 0x20));
    QDebug::operator<<((QDebug *)in_RCX,
                       (QString *)CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  in_RDI->d = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI->name = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_2 = &DAT_aaaaaaaaaaaaaaaa;
  in_RDI[1].d = &DAT_aaaaaaaaaaaaaaaa;
  QDBusVariant::QDBusVariant((QDBusVariant *)0xae9513);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDBusVariant *)this_00;
}

Assistant:

QDBusVariant QDBusMenuAdaptor::GetProperty(int id, const QString &name)
{
    qCDebug(qLcMenu) << id << name;
    // handle method call com.canonical.dbusmenu.GetProperty
    QDBusVariant value;
    return value;
}